

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

ATTRIBUTE_ID * getAttributeId(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  KEY name;
  STRING_POOL *pool;
  XML_Char XVar1;
  int iVar2;
  XML_Char *pXVar3;
  ATTRIBUTE_ID *pAVar4;
  undefined1 *puVar5;
  char cVar6;
  PREFIX *pPVar7;
  long lVar8;
  long lVar9;
  
  pool = (STRING_POOL *)((long)parser + 0x330);
  puVar5 = *(undefined1 **)((long)parser + 0x348);
  if (puVar5 == *(undefined1 **)((long)parser + 0x340)) {
    iVar2 = poolGrow(pool);
    if (iVar2 == 0) {
      return (ATTRIBUTE_ID *)0x0;
    }
    puVar5 = *(undefined1 **)((long)parser + 0x348);
  }
  *(undefined1 **)((long)parser + 0x348) = puVar5 + 1;
  *puVar5 = 0;
  pXVar3 = poolStoreString(pool,enc,start,end);
  if (pXVar3 != (XML_Char *)0x0) {
    name = pXVar3 + 1;
    pAVar4 = (ATTRIBUTE_ID *)lookup((HASH_TABLE *)((long)parser + 0x2e0),name,0x18);
    if (pAVar4 != (ATTRIBUTE_ID *)0x0) {
      if (pAVar4->name != name) {
        *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
        return pAVar4;
      }
      puVar5 = *(undefined1 **)((long)parser + 0x348);
      *(undefined1 **)((long)parser + 0x350) = puVar5;
      if (*(int *)((long)parser + 0x1c8) == 0) {
        return pAVar4;
      }
      cVar6 = *name;
      if ((((cVar6 == 'x') && (pXVar3[2] == 'm')) && (pXVar3[3] == 'l')) &&
         ((pXVar3[4] == 'n' && (pXVar3[5] == 's')))) {
        if (pXVar3[6] == ':') {
          pPVar7 = (PREFIX *)lookup((HASH_TABLE *)((long)parser + 0x308),pXVar3 + 7,0x10);
        }
        else {
          if (pXVar3[6] != '\0') goto LAB_00151912;
          pPVar7 = (PREFIX *)((long)parser + 0x390);
        }
        pAVar4->prefix = pPVar7;
        pAVar4->xmlns = '\x01';
        return pAVar4;
      }
LAB_00151912:
      lVar8 = 0;
      while( true ) {
        if (cVar6 == '\0') {
          return pAVar4;
        }
        if (cVar6 == ':') break;
        cVar6 = pXVar3[lVar8 + 2];
        lVar8 = lVar8 + 1;
      }
      if (lVar8 != 0) {
        lVar9 = 0;
        do {
          pXVar3 = *(XML_Char **)((long)parser + 0x348);
          if (pXVar3 == *(XML_Char **)((long)parser + 0x340)) {
            iVar2 = poolGrow(pool);
            if (iVar2 == 0) {
              return (ATTRIBUTE_ID *)0x0;
            }
            pXVar3 = *(XML_Char **)((long)parser + 0x348);
          }
          XVar1 = name[lVar9];
          *(XML_Char **)((long)parser + 0x348) = pXVar3 + 1;
          *pXVar3 = XVar1;
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
        puVar5 = *(undefined1 **)((long)parser + 0x348);
      }
      if (puVar5 == *(undefined1 **)((long)parser + 0x340)) {
        iVar2 = poolGrow(pool);
        if (iVar2 == 0) {
          return (ATTRIBUTE_ID *)0x0;
        }
        puVar5 = *(undefined1 **)((long)parser + 0x348);
      }
      *(undefined1 **)((long)parser + 0x348) = puVar5 + 1;
      *puVar5 = 0;
      pPVar7 = (PREFIX *)
               lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x350),0x10);
      pAVar4->prefix = pPVar7;
      if (pPVar7->name == *(KEY *)((long)parser + 0x350)) {
        *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
        return pAVar4;
      }
      *(KEY *)((long)parser + 0x348) = *(KEY *)((long)parser + 0x350);
      return pAVar4;
    }
  }
  return (ATTRIBUTE_ID *)0x0;
}

Assistant:

static ATTRIBUTE_ID *
getAttributeId(XML_Parser parser, const ENCODING *enc, const char *start, const char *end)
{
  ATTRIBUTE_ID *id;
  const XML_Char *name;
  if (!poolAppendChar(&dtd.pool, XML_T('\0')))
    return 0;
  name = poolStoreString(&dtd.pool, enc, start, end);
  if (!name)
    return 0;
  ++name;
  id = (ATTRIBUTE_ID *)lookup(&dtd.attributeIds, name, sizeof(ATTRIBUTE_ID));
  if (!id)
    return 0;
  if (id->name != name)
    poolDiscard(&dtd.pool);
  else {
    poolFinish(&dtd.pool);
    if (!ns)
      ;
    else if (name[0] == 'x'
        && name[1] == 'm'
        && name[2] == 'l'
        && name[3] == 'n'
        && name[4] == 's'
        && (name[5] == XML_T('\0') || name[5] == XML_T(':'))) {
      if (name[5] == '\0')
        id->prefix = &dtd.defaultPrefix;
      else
        id->prefix = (PREFIX *)lookup(&dtd.prefixes, name + 6, sizeof(PREFIX));
      id->xmlns = 1;
    }
    else {
      int i;
      for (i = 0; name[i]; i++) {
        if (name[i] == XML_T(':')) {
          int j;
          for (j = 0; j < i; j++) {
            if (!poolAppendChar(&dtd.pool, name[j]))
              return 0;
          }
          if (!poolAppendChar(&dtd.pool, XML_T('\0')))
            return 0;
          id->prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&dtd.pool), sizeof(PREFIX));
          if (id->prefix->name == poolStart(&dtd.pool))
            poolFinish(&dtd.pool);
          else
            poolDiscard(&dtd.pool);
          break;
        }
      }
    }
  }
  return id;
}